

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O1

uint __thiscall crnlib::dxt_image::get_pixel_alpha(dxt_image *this,uint x,uint y,uint element_index)

{
  element_type eVar1;
  element *peVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  uVar9 = x >> 2;
  uVar6 = y >> 2;
  eVar1 = this->m_element_type[element_index];
  uVar3 = 0xff;
  if (eVar1 != cAlphaDXT5) {
    if (eVar1 == cAlphaDXT3) {
      uVar3 = dxt3_block::get_alpha
                        ((dxt3_block *)
                         (this->m_pElements +
                         ((uVar6 * this->m_blocks_x + uVar9) * this->m_num_elements_per_block +
                         element_index)),x & 3,y & 3,true);
      return uVar3;
    }
    if ((eVar1 == cColorDXT1) && (this->m_format < cDXT3)) {
      peVar2 = this->m_pElements;
      uVar6 = (uVar6 * this->m_blocks_x + uVar9) * this->m_num_elements_per_block + element_index;
      if (*(ushort *)peVar2[uVar6].m_bytes <= *(ushort *)(peVar2[uVar6].m_bytes + 2)) {
        uVar3 = 0xff;
        if ((~(peVar2[uVar6].m_bytes[(ulong)(y & 3) + 4] >> ((char)x * '\x02' & 6U)) & 3) == 0) {
          uVar3 = 0;
        }
      }
    }
switchD_001967d1_caseD_7:
    return uVar3;
  }
  peVar2 = this->m_pElements;
  uVar7 = (uVar6 * this->m_blocks_x + uVar9) * this->m_num_elements_per_block + element_index;
  uVar8 = (uint)peVar2[uVar7].m_bytes[0];
  uVar10 = (uint)peVar2[uVar7].m_bytes[1];
  uVar6 = (x & 3) + (y & 3) * 4;
  uVar9 = uVar6 * 3;
  uVar4 = (ulong)(uVar9 >> 3);
  uVar5 = (uint)peVar2[uVar7].m_bytes[uVar4 + 2];
  if (uVar6 < 0xe) {
    uVar5 = (uint)CONCAT11(peVar2[uVar7].m_bytes[uVar4 + 3],peVar2[uVar7].m_bytes[uVar4 + 2]);
  }
  uVar6 = uVar5 >> ((byte)uVar9 & 7) & 7;
  if (peVar2[uVar7].m_bytes[1] < peVar2[uVar7].m_bytes[0]) {
    switch(uVar6) {
    case 0:
switchD_001967b5_caseD_0:
      return uVar8;
    case 1:
switchD_001967b5_caseD_1:
      return uVar10;
    case 2:
      uVar4 = (ulong)(uVar10 + uVar8 * 6);
      break;
    case 3:
      uVar4 = (ulong)(uVar8 * 5 + uVar10 * 2);
      break;
    case 4:
      uVar4 = (ulong)(uVar10 * 3 + uVar8 * 4);
      break;
    case 5:
      uVar4 = (ulong)(uVar8 * 3 + uVar10 * 4);
      break;
    case 6:
      uVar4 = (ulong)(uVar10 * 5 + uVar8 * 2);
      break;
    case 7:
      uVar4 = (ulong)(uVar8 + uVar10 * 6);
    }
    uVar3 = (uint)(uVar4 / 7);
  }
  else {
    switch(uVar6) {
    case 0:
      goto switchD_001967b5_caseD_0;
    case 1:
      goto switchD_001967b5_caseD_1;
    case 2:
      uVar4 = (ulong)(uVar10 + uVar8 * 4);
      break;
    case 3:
      uVar4 = (ulong)(uVar8 * 3 + uVar10 * 2);
      break;
    case 4:
      uVar4 = (ulong)(uVar10 * 3 + uVar8 * 2);
      break;
    case 5:
      uVar4 = (ulong)(uVar8 + uVar10 * 4);
      break;
    case 6:
      return 0;
    case 7:
      goto switchD_001967d1_caseD_7;
    }
    uVar3 = (uint)(uVar4 / 5);
  }
  return uVar3;
}

Assistant:

uint dxt_image::get_pixel_alpha(uint x, uint y, uint element_index) const {
  CRNLIB_ASSERT((x < m_width) && (y < m_height) && (element_index < m_num_elements_per_block));

  const uint block_x = x >> cDXTBlockShift;
  const uint block_y = y >> cDXTBlockShift;

  switch (m_element_type[element_index]) {
    case cColorDXT1: {
      if (m_format <= cDXT1A) {
        const dxt1_block* pBlock = reinterpret_cast<const dxt1_block*>(&get_element(block_x, block_y, element_index));

        const uint l = pBlock->get_low_color();
        const uint h = pBlock->get_high_color();

        if (l <= h) {
          uint s = pBlock->get_selector(x & 3, y & 3);

          return (s == 3) ? 0 : 255;
        } else {
          return 255;
        }
      }

      break;
    }
    case cAlphaDXT5: {
      const dxt5_block* pBlock = reinterpret_cast<const dxt5_block*>(&get_element(block_x, block_y, element_index));

      const uint l = pBlock->get_low_alpha();
      const uint h = pBlock->get_high_alpha();

      const uint s = pBlock->get_selector(x & 3, y & 3);

      if (l > h) {
        switch (s) {
          case 0:
            return l;
          case 1:
            return h;
          case 2:
            return (l * 6 + h) / 7;
          case 3:
            return (l * 5 + h * 2) / 7;
          case 4:
            return (l * 4 + h * 3) / 7;
          case 5:
            return (l * 3 + h * 4) / 7;
          case 6:
            return (l * 2 + h * 5) / 7;
          case 7:
            return (l + h * 6) / 7;
        }
      } else {
        switch (s) {
          case 0:
            return l;
          case 1:
            return h;
          case 2:
            return (l * 4 + h) / 5;
          case 3:
            return (l * 3 + h * 2) / 5;
          case 4:
            return (l * 2 + h * 3) / 5;
          case 5:
            return (l + h * 4) / 5;
          case 6:
            return 0;
          case 7:
            return 255;
        }
      }
    }
    case cAlphaDXT3: {
      const dxt3_block* pBlock = reinterpret_cast<const dxt3_block*>(&get_element(block_x, block_y, element_index));

      return pBlock->get_alpha(x & 3, y & 3, true);
    }
    default:
      break;
  }

  return 255;
}